

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testopal.cpp
# Opt level: O1

void change_setting_proc(Am_Object *self)

{
  char cVar1;
  undefined1 uVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Am_Value *pAVar8;
  Am_Wrapper *pAVar9;
  Am_Object *pAVar10;
  undefined1 *puVar11;
  ostream *poVar12;
  char *pcVar13;
  ulong uVar14;
  Am_Style *pAVar15;
  byte bVar16;
  bool bVar17;
  Am_Input_Char c;
  Am_Object in_obj;
  Am_Object inter;
  Am_Input_Char local_114;
  Am_Object local_110;
  Am_Object local_108;
  Am_Object local_100;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Input_Char local_9c;
  Am_Input_Char local_98;
  Am_Input_Char local_94;
  Am_Input_Char local_90;
  Am_Input_Char local_8c;
  Am_Input_Char local_88;
  Am_Input_Char local_84;
  Am_Input_Char local_80;
  Am_Input_Char local_7c;
  Am_Input_Char local_78;
  Am_Input_Char local_74;
  Am_Input_Char local_70;
  Am_Input_Char local_6c;
  Am_Input_Char local_68;
  Am_Input_Char local_64;
  Am_Input_Char local_60;
  Am_Input_Char local_5c;
  Am_Input_Char local_58;
  Am_Input_Char local_54;
  Am_Input_Char local_50;
  Am_Input_Char local_4c;
  Am_Input_Char local_48;
  Am_Input_Char local_44;
  Am_Input_Char local_40;
  Am_Input_Char local_3c;
  Am_Input_Char local_38;
  Am_Input_Char local_34;
  Am_Input_Char local_30;
  Am_Input_Char local_2c;
  Am_Input_Char local_28;
  Am_Input_Char local_24;
  
  Am_Object::Get_Object((ushort)&local_108,(ulong)self);
  pAVar8 = (Am_Value *)Am_Object::Get((ushort)&local_108,0x11b);
  Am_Input_Char::Am_Input_Char(&local_114,pAVar8);
  Am_Input_Char::Am_Input_Char(&local_24,"q",true);
  bVar17 = ((uint)local_24 & 0xffff) != 0x103;
  if ((!(bool)((bVar17 && local_114.code == 0x103) | ~(bVar17 || local_114.code == 0x103) & 1U)) &&
     (cVar1 = Am_Input_Char::helper_check_equal((Am_Input_Char *)&local_114), cVar1 != '\0')) {
    pAVar9 = Am_Object::operator_cast_to_Am_Wrapper_(&screen2);
    if (pAVar9 != (Am_Wrapper *)0x0) {
      Am_Object::Destroy();
    }
    Am_Exit_Main_Event_Loop();
    goto LAB_00104949;
  }
  Am_Input_Char::Am_Input_Char(&local_28,"?",true);
  bVar17 = ((uint)local_28 & 0xffff) != 0x103;
  if ((!(bool)((bVar17 && local_114.code == 0x103) | ~(bVar17 || local_114.code == 0x103) & 1U)) &&
     (cVar1 = Am_Input_Char::helper_check_equal((Am_Input_Char *)&local_114), cVar1 != '\0')) {
LAB_00104375:
    print_help();
    goto LAB_00104949;
  }
  Am_Input_Char::Am_Input_Char(&local_2c,"0",true);
  bVar17 = ((uint)local_2c & 0xffff) != 0x103;
  if ((!(bool)((bVar17 && local_114.code == 0x103) | ~(bVar17 || local_114.code == 0x103) & 1U)) &&
     (cVar1 = Am_Input_Char::helper_check_equal((Am_Input_Char *)&local_114), cVar1 != '\0')) {
    if (change_setting_proc(Am_Object)::mode0 == '\x01') {
      change_setting_proc(Am_Object)::mode0 = '\0';
      uVar3 = Am_Object::Set(0xb348,100,0x5a);
      Am_Object::Set(uVar3,0x65,0x5a);
      Am_Object::Am_Object(&local_a8,&g1);
      Am_Object::Add_Part((Am_Object)0x10b2f8,SUB81(&local_a8,0),1);
      Am_Object::~Am_Object(&local_a8);
      uVar3 = Am_Object::Set(0xb348,100,0x8c);
      uVar14 = 0x96;
    }
    else {
      change_setting_proc(Am_Object)::mode0 = '\x01';
      uVar3 = Am_Object::Set(0xb348,100,100);
      Am_Object::Set(uVar3,0x65,100);
      Am_Object::Remove_From_Owner();
      uVar14 = 0x5a;
      uVar3 = Am_Object::Set(0xb348,100,0x5a);
    }
    goto LAB_00104818;
  }
  Am_Input_Char::Am_Input_Char(&local_30,"1",true);
  bVar17 = ((uint)local_30 & 0xffff) != 0x103;
  if ((!(bool)((bVar17 && local_114.code == 0x103) | ~(bVar17 || local_114.code == 0x103) & 1U)) &&
     (cVar1 = Am_Input_Char::helper_check_equal((Am_Input_Char *)&local_114), cVar1 != '\0')) {
    change_setting_proc(Am_Object)::mode1 = change_setting_proc(Am_Object)::mode1 != '\x01';
    if ((bool)change_setting_proc(Am_Object)::mode1) {
      pcVar13 = "Hello World!";
    }
    else {
      pcVar13 = "Test Opal";
    }
    uVar3 = 0x6c;
LAB_0010483f:
    Am_Object::Set(0xb2f8,(char *)(ulong)uVar3,(ulong)pcVar13);
    goto LAB_00104949;
  }
  Am_Input_Char::Am_Input_Char(&local_34,"2",true);
  bVar17 = ((uint)local_34 & 0xffff) != 0x103;
  if (((bool)((bVar17 && local_114.code == 0x103) | ~(bVar17 || local_114.code == 0x103) & 1U)) ||
     (cVar1 = Am_Input_Char::helper_check_equal((Am_Input_Char *)&local_114), cVar1 == '\0')) {
    Am_Input_Char::Am_Input_Char(&local_38,"3",true);
    bVar17 = ((uint)local_38 & 0xffff) != 0x103;
    if (((bool)((bVar17 && local_114.code == 0x103) | ~(bVar17 || local_114.code == 0x103) & 1U)) ||
       (cVar1 = Am_Input_Char::helper_check_equal((Am_Input_Char *)&local_114), cVar1 == '\0')) {
      Am_Input_Char::Am_Input_Char(&local_3c,"4",true);
      bVar17 = Am_Input_Char::operator==(&local_114,local_3c);
      if (bVar17) {
        if (change_setting_proc(Am_Object)::mode4 != '\x01') {
          puVar11 = &change_setting_proc(Am_Object)::mode4;
LAB_00104863:
          *puVar11 = 1;
          Am_Object::Remove_From_Owner();
          goto LAB_00104949;
        }
        change_setting_proc(Am_Object)::mode4 = '\0';
        Am_Object::Am_Object(&local_b8,&g1);
        Am_Object::Add_Part((Am_Object)0x10b2f8,SUB81(&local_b8,0),1);
        pAVar10 = &local_b8;
        goto LAB_00104736;
      }
      Am_Input_Char::Am_Input_Char(&local_40,"5",true);
      bVar17 = Am_Input_Char::operator==(&local_114,local_40);
      if (bVar17) {
        cVar1 = Am_Object::Valid();
        if (cVar1 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "** Can\'t do test 5 now because rectangle is gone; Use 2 to bring it back\n",
                     0x49);
          std::ostream::flush();
          goto LAB_00104949;
        }
        if (change_setting_proc(Am_Object)::mode5 == '\x01') {
          change_setting_proc(Am_Object)::mode5 = '\0';
          uVar14 = 5;
          uVar3 = Am_Object::Set(0xb350,100,5);
        }
        else {
          change_setting_proc(Am_Object)::mode5 = '\x01';
          uVar14 = 10;
          uVar3 = Am_Object::Set(0xb350,100,10);
        }
        goto LAB_00104818;
      }
      Am_Input_Char::Am_Input_Char(&local_44,"6",true);
      bVar17 = Am_Input_Char::operator==(&local_114,local_44);
      if (bVar17) {
        change_setting_proc(Am_Object)::mode6 = change_setting_proc(Am_Object)::mode6 != '\x01';
        if ((bool)change_setting_proc(Am_Object)::mode6) {
          uVar14 = 0x82;
        }
        else {
          uVar14 = 0x96;
        }
        uVar4 = 0x65;
LAB_001049ef:
        uVar3 = 0xb318;
      }
      else {
        Am_Input_Char::Am_Input_Char(&local_48,"7",true);
        bVar17 = Am_Input_Char::operator==(&local_114,local_48);
        if (bVar17) {
          if (change_setting_proc(Am_Object)::mode7 == '\x01') {
            change_setting_proc(Am_Object)::mode7 = '\0';
            bVar16 = 1;
            uVar2 = 0x69;
            uVar4 = 0xb318;
          }
          else {
            change_setting_proc(Am_Object)::mode7 = '\x01';
            uVar2 = 0x69;
            uVar4 = 0xb318;
            bVar16 = 0;
          }
          goto LAB_00104912;
        }
        Am_Input_Char::Am_Input_Char(&local_4c,"8",true);
        bVar17 = Am_Input_Char::operator==(&local_114,local_4c);
        if (bVar17) {
          change_setting_proc(Am_Object)::mode8 = change_setting_proc(Am_Object)::mode8 != '\x01';
          if ((bool)change_setting_proc(Am_Object)::mode8) {
            uVar14 = 100;
          }
          else {
            uVar14 = 0x50;
          }
          uVar4 = 0x66;
          goto LAB_001049ef;
        }
        Am_Input_Char::Am_Input_Char(&local_50,"9",true);
        bVar17 = Am_Input_Char::operator==(&local_114,local_50);
        if (!bVar17) {
          Am_Input_Char::Am_Input_Char(&local_54,"a",true);
          bVar17 = Am_Input_Char::operator==(&local_114,local_54);
          if (bVar17) {
            if (change_setting_proc(Am_Object)::modea == 0) {
              pAVar15 = (Am_Style *)&Am_Yellow;
            }
            else {
              pAVar15 = (Am_Style *)&Am_White;
            }
            change_setting_proc(Am_Object)::modea = change_setting_proc(Am_Object)::modea ^ 1;
            pAVar9 = Am_Style::operator_cast_to_Am_Wrapper_(pAVar15);
            Am_Object::Set(0xb340,(Am_Wrapper *)0x6a,(ulong)pAVar9);
            goto LAB_00104949;
          }
          Am_Input_Char::Am_Input_Char(&local_58,"b",true);
          bVar17 = Am_Input_Char::operator==(&local_114,local_58);
          if (bVar17) {
            if (change_setting_proc(Am_Object)::modeb == '\x01') {
              change_setting_proc(Am_Object)::modeb = '\0';
LAB_001048ce:
              Am_Object::Destroy();
              goto LAB_00104949;
            }
            change_setting_proc(Am_Object)::modeb = '\x01';
            Am_Object::Create((char *)&local_110);
            pAVar10 = (Am_Object *)Am_Object::Set((ushort)&local_110,100,0x177);
            Am_Object::operator=(&second,pAVar10);
            Am_Object::~Am_Object(&local_110);
            Am_Object::Get_Object((ushort)&local_110,0x10b308);
            pAVar8 = (Am_Value *)Am_Object::Get((ushort)&local_110,0x86);
            iVar5 = Am_Value::operator_cast_to_int(pAVar8);
            Am_Object::~Am_Object(&local_110);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Depth of r1 = ",0xe);
            poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," [-1]",5);
            std::endl<char,std::char_traits<char>>(poVar12);
            Am_Object::Am_Object(&local_c0,&second);
            Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_c0,0),1);
            pAVar10 = &local_c0;
          }
          else {
            Am_Input_Char::Am_Input_Char(&local_5c,"c",true);
            bVar17 = Am_Input_Char::operator==(&local_114,local_5c);
            if (bVar17) {
              if (change_setting_proc(Am_Object)::modec != '\x01') {
                puVar11 = &change_setting_proc(Am_Object)::modec;
                goto LAB_00104863;
              }
              change_setting_proc(Am_Object)::modec = '\0';
              Am_Object::Am_Object(&local_c8,&window);
              Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_c8,0),1);
              pAVar10 = &local_c8;
            }
            else {
              Am_Input_Char::Am_Input_Char(&local_60,"d",true);
              bVar17 = Am_Input_Char::operator==(&local_114,local_60);
              if (bVar17) {
                if (change_setting_proc(Am_Object)::moded == '\x01') {
                  change_setting_proc(Am_Object)::moded = '\0';
                  goto LAB_001048ce;
                }
                change_setting_proc(Am_Object)::moded = '\x01';
                Am_Object::Copy((char *)&local_110);
                pAVar10 = (Am_Object *)Am_Object::Set((ushort)&local_110,0x65,0x1c7);
                Am_Object::operator=(&third,pAVar10);
                Am_Object::~Am_Object(&local_110);
                Am_Object::Am_Object(&local_d0,&third);
                Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_d0,0),1);
                pAVar10 = &local_d0;
              }
              else {
                Am_Input_Char::Am_Input_Char(&local_64,"e",true);
                bVar17 = Am_Input_Char::operator==(&local_114,local_64);
                if (bVar17) {
                  if (change_setting_proc(Am_Object)::modee == '\x01') {
                    change_setting_proc(Am_Object)::modee = '\0';
                    Am_Object::Get_Object((ushort)&local_d8,0x10b348);
                    Am_To_Bottom((Am_Object_Data *)&local_d8);
                    pAVar10 = &local_d8;
                  }
                  else {
                    change_setting_proc(Am_Object)::modee = '\x01';
                    Am_Object::Get_Object((ushort)&local_e0,0x10b348);
                    Am_To_Top((Am_Object_Data *)&local_e0);
                    pAVar10 = &local_e0;
                  }
                }
                else {
                  Am_Input_Char::Am_Input_Char(&local_68,"f",true);
                  bVar17 = Am_Input_Char::operator==(&local_114,local_68);
                  if (!bVar17) {
                    Am_Input_Char::Am_Input_Char(&local_6c,"g",true);
                    bVar17 = Am_Input_Char::operator==(&local_114,local_6c);
                    if (bVar17) {
                      pcVar13 = "Hello World";
                      if (change_setting_proc::mode != false) {
                        pcVar13 = "Foo and Bar";
                      }
                      uVar3 = 0x6d;
                      change_setting_proc::mode = (bool)(change_setting_proc::mode ^ 1);
                      goto LAB_0010483f;
                    }
                    Am_Input_Char::Am_Input_Char(&local_70,"h",true);
                    bVar17 = Am_Input_Char::operator==(&local_114,local_70);
                    if (bVar17) {
                      bVar16 = change_setting_proc(Am_Object)::mode ^ 1;
                      uVar2 = 0x79;
                      change_setting_proc(Am_Object)::mode = (bool)bVar16;
                    }
                    else {
                      Am_Input_Char::Am_Input_Char(&local_74,"i",true);
                      bVar17 = Am_Input_Char::operator==(&local_114,local_74);
                      if (!bVar17) {
                        Am_Input_Char::Am_Input_Char(&local_78,"j",true);
                        bVar17 = Am_Input_Char::operator==(&local_114,local_78);
                        if (bVar17) {
                          if (change_setting_proc(Am_Object)::mode == false) {
                            pAVar15 = (Am_Style *)&Am_Blue;
                          }
                          else {
                            pAVar15 = (Am_Style *)&Am_Orange;
                          }
                          pAVar9 = Am_Style::operator_cast_to_Am_Wrapper_(pAVar15);
                          Am_Object::Set(0xb2f8,(Am_Wrapper *)0x6a,(ulong)pAVar9);
                          change_setting_proc(Am_Object)::mode =
                               (bool)(change_setting_proc(Am_Object)::mode ^ 1);
                          goto LAB_00104949;
                        }
                        Am_Input_Char::Am_Input_Char(&local_7c,"k",true);
                        bVar17 = Am_Input_Char::operator==(&local_114,local_7c);
                        if (bVar17) {
                          (*(code *)(&DAT_00108014 +
                                    *(int *)(&DAT_00108014 +
                                            (ulong)(uint)change_setting_proc(Am_Object)::mode * 4)))
                                    ();
                          return;
                        }
                        Am_Input_Char::Am_Input_Char(&local_80,"l",true);
                        bVar17 = Am_Input_Char::operator==(&local_114,local_80);
                        if (bVar17) {
                          (*(code *)(&DAT_00108004 +
                                    *(int *)(&DAT_00108004 +
                                            (ulong)(uint)change_setting_proc(Am_Object)::mode * 4)))
                                    ();
                          return;
                        }
                        Am_Input_Char::Am_Input_Char(&local_84,"X",true);
                        bVar17 = Am_Input_Char::operator==(&local_114,local_84);
                        if (bVar17) {
                          pAVar8 = (Am_Value *)Am_Object::Get(0xb330,0x8b);
                          iVar5 = Am_Value::operator_cast_to_int(pAVar8);
                          Am_Object::Set(0xb330,0x8b,(ulong)(iVar5 + 5));
                          goto LAB_00104949;
                        }
                        Am_Input_Char::Am_Input_Char(&local_88,"p",true);
                        bVar17 = Am_Input_Char::operator==(&local_114,local_88);
                        if (bVar17) {
                          pAVar8 = (Am_Value *)Am_Object::Get((ushort)&local_108,0x11f);
                          iVar5 = Am_Value::operator_cast_to_int(pAVar8);
                          pAVar8 = (Am_Value *)Am_Object::Get((ushort)&local_108,0x120);
                          uVar6 = Am_Value::operator_cast_to_int(pAVar8);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,"Checking point (",0x10);
                          poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5)
                          ;
                          std::__ostream_insert<char,std::char_traits<char>>(poVar12,",",1);
                          poVar12 = (ostream *)std::ostream::operator<<((ostream *)poVar12,uVar6);
                          std::__ostream_insert<char,std::char_traits<char>>(poVar12,")\n",2);
                          std::ostream::flush();
                          Am_Point_In_Leaf(&local_110,0x10b2f8,iVar5,(Am_Object *)(ulong)uVar6,true,
                                           true);
                          pAVar9 = Am_Object::operator_cast_to_Am_Wrapper_(&local_110);
                          if (pAVar9 == (Am_Wrapper *)0x0) {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout," NOT in an object\n",0x12);
                          }
                          else {
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)&std::cout,"   in object ",0xd);
                            poVar12 = (ostream *)operator<<((ostream *)&std::cout,&local_110);
                            std::endl<char,std::char_traits<char>>(poVar12);
                          }
                          std::ostream::flush();
                          goto LAB_0010461d;
                        }
                        Am_Input_Char::Am_Input_Char(&local_8c,"Y",true);
                        bVar17 = Am_Input_Char::operator==(&local_114,local_8c);
                        if (bVar17) {
                          pAVar8 = (Am_Value *)Am_Object::Get(0xb330,0x8b);
                          iVar5 = Am_Value::operator_cast_to_int(pAVar8);
                          pAVar8 = (Am_Value *)Am_Object::Get(0xb330,0x8c);
                          iVar7 = Am_Value::operator_cast_to_int(pAVar8);
                          Am_Object::Set(0xb330,0x8b,(ulong)(iVar5 + 5));
                          Am_Object::Set(0xb330,0x8c,(ulong)(iVar7 + 5));
                          goto LAB_00104949;
                        }
                        Am_Input_Char::Am_Input_Char(&local_90,"M",true);
                        bVar17 = Am_Input_Char::operator==(&local_114,local_90);
                        if (bVar17) {
                          pAVar8 = (Am_Value *)Am_Object::Get(0xb330,100);
                          iVar5 = Am_Value::operator_cast_to_int(pAVar8);
                          Am_Object::Set(0xb330,100,(ulong)(iVar5 + 5));
                          goto LAB_00104949;
                        }
                        Am_Input_Char::Am_Input_Char(&local_94,"W",true);
                        bVar17 = Am_Input_Char::operator==(&local_114,local_94);
                        if (bVar17) {
                          pAVar8 = (Am_Value *)Am_Object::Get(0xb330,0x66);
                          iVar5 = Am_Value::operator_cast_to_int(pAVar8);
                          Am_Object::Set(0xb330,0x66,(ulong)(iVar5 + 5));
                          goto LAB_00104949;
                        }
                        Am_Input_Char::Am_Input_Char(&local_98,"R",true);
                        bVar17 = Am_Input_Char::operator==(&local_114,local_98);
                        if (!bVar17) {
                          Am_Input_Char::Am_Input_Char(&local_9c,"C",true);
                          bVar17 = Am_Input_Char::operator==(&local_114,local_9c);
                          if (!bVar17) goto LAB_00104375;
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cout,
                                     "** Adding object to a non-group obj. **THIS SHOULD CRASH**\n\n"
                                     ,0x3c);
                          Am_Object::Create((char *)&local_110);
                          Am_Object::Am_Object(&local_100,&local_110);
                          Am_Object::Add_Part((Am_Object)0x10b330,false,1);
                          pAVar10 = &local_100;
                          goto LAB_00104618;
                        }
                        uVar3 = Am_Object::Set(0xb330,0x8b,0x46);
                        uVar3 = Am_Object::Set(uVar3,0x8c,0xf);
                        uVar14 = 0x91;
                        uVar3 = Am_Object::Set(uVar3,0x8d,0x91);
                        uVar4 = 0x8e;
                        goto LAB_0010481c;
                      }
                      bVar16 = change_setting_proc(Am_Object)::mode ^ 1;
                      uVar2 = 0x76;
                      change_setting_proc(Am_Object)::mode = (bool)bVar16;
                    }
                    uVar4 = 0xb2f8;
                    goto LAB_00104912;
                  }
                  if (change_setting_proc(Am_Object)::modef == '\x01') {
                    change_setting_proc(Am_Object)::modef = '\0';
                    Am_Object::Am_Object(&local_e8,&r1);
                    Am_To_Bottom((Am_Object_Data *)&local_e8);
                    pAVar10 = &local_e8;
                  }
                  else {
                    change_setting_proc(Am_Object)::modef = '\x01';
                    Am_Object::Am_Object(&local_f0,&r1);
                    Am_Object::Am_Object(&local_f8,&r2);
                    Am_Move_Object((Am_Object_Data *)&local_f0,(Am_Object_Data *)&local_f8,true);
                    Am_Object::~Am_Object(&local_f8);
                    pAVar10 = &local_f0;
                  }
                }
              }
            }
          }
          goto LAB_00104736;
        }
        change_setting_proc(Am_Object)::mode9 = change_setting_proc(Am_Object)::mode9 != '\x01';
        if ((bool)change_setting_proc(Am_Object)::mode9) {
          uVar14 = 0xfa;
        }
        else {
          uVar14 = 200;
        }
        uVar4 = 0x66;
        uVar3 = 0xb2f8;
      }
    }
    else {
      if (change_setting_proc(Am_Object)::mode3 != '\x01') {
        change_setting_proc(Am_Object)::mode3 = '\x01';
        uVar4 = 0xb338;
        uVar3 = Am_Object::Set(0xb338,100,100);
        bVar16 = 0;
        Am_Object::Set(uVar3,0x65,100);
        uVar2 = 0x69;
LAB_00104912:
        Am_Object::Set(uVar4,(bool)uVar2,(ulong)bVar16);
        goto LAB_00104949;
      }
      change_setting_proc(Am_Object)::mode3 = '\0';
      Am_Object::Set(0xb338,true,1);
      uVar14 = 0x14;
      uVar3 = Am_Object::Set(0xb338,100,0x14);
LAB_00104818:
      uVar4 = 0x65;
    }
LAB_0010481c:
    Am_Object::Set(uVar3,(uint)uVar4,uVar14);
  }
  else {
    if (change_setting_proc(Am_Object)::mode2 != '\x01') {
      change_setting_proc(Am_Object)::mode2 = '\x01';
      goto LAB_001048ce;
    }
    change_setting_proc(Am_Object)::mode2 = '\0';
    Am_Object::Create((char *)&local_110);
    pAVar9 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
    uVar3 = Am_Object::Set((ushort)&local_110,(Am_Wrapper *)0x6a,(ulong)pAVar9);
    uVar3 = Am_Object::Set(uVar3,100,5);
    uVar3 = Am_Object::Set(uVar3,0x65,5);
    uVar3 = Am_Object::Set(uVar3,0x66,0x32);
    pAVar10 = (Am_Object *)Am_Object::Set(uVar3,0x67,0x1e);
    pAVar10 = (Am_Object *)Am_Object::operator=(&eek,pAVar10);
    Am_Object::Am_Object(&local_b0,pAVar10);
    Am_Object::Add_Part((Am_Object)0x10b348,SUB81(&local_b0,0),1);
    pAVar10 = &local_b0;
LAB_00104618:
    Am_Object::~Am_Object(pAVar10);
LAB_0010461d:
    pAVar10 = &local_110;
LAB_00104736:
    Am_Object::~Am_Object(pAVar10);
  }
LAB_00104949:
  Am_Object::~Am_Object(&local_108);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, change_setting, (Am_Object self))
{
  Am_Object inter = self.Get_Owner();
  Am_Input_Char c = inter.Get(Am_START_CHAR);
  if (c == "q") {
    if (screen2)
      screen2.Destroy();
    Am_Exit_Main_Event_Loop();
  } else if (c == "?") {
    print_help();
  } else if (c == "0") {
    static bool mode0 = false;
    if (mode0) {
      mode0 = false;
      g1.Set(Am_LEFT, 90).Set(Am_TOP, 90);
      window.Add_Part(g1);
      g1.Set(Am_LEFT, 140).Set(Am_TOP, 150);
    } else {
      mode0 = true;
      g1.Set(Am_LEFT, 100).Set(Am_TOP, 100);
      g1.Remove_From_Owner();
      g1.Set(Am_LEFT, 90).Set(Am_TOP, 90);
    }
  } else if (c == "1") {
    static bool mode1 = false;
    if (mode1) {
      mode1 = false;
      window.Set(Am_TITLE, "Test Opal");
    } else {
      mode1 = true;
      window.Set(Am_TITLE, "Hello World!");
    }
  } else if (c == "2") {
    static bool mode2 = false;
    if (mode2) {
      mode2 = false;
      g1.Add_Part(eek = Am_Rectangle.Create("eek")
                            .Set(Am_FILL_STYLE, Am_Blue)
                            .Set(Am_LEFT, 5)
                            .Set(Am_TOP, 5)
                            .Set(Am_WIDTH, 50)
                            .Set(Am_HEIGHT, 30));
    } else {
      mode2 = true;
      eek.Destroy();
    }
  } else if (c == "3") {
    static bool mode3 = false;
    if (mode3) {
      mode3 = false;
      r2.Set(Am_VISIBLE, true);
      r2.Set(Am_LEFT, 20).Set(Am_TOP, 20);
    } else {
      mode3 = true;
      r2.Set(Am_LEFT, 100).Set(Am_TOP, 100);
      r2.Set(Am_VISIBLE, false);
    }
  } else if (c == "4") {
    static bool mode4 = false;
    if (mode4) {
      mode4 = false;
      window.Add_Part(g1);
    } else {
      mode4 = true;
      g1.Remove_From_Owner();
    }
  } else if (c == "5") {
    if (!eek.Valid()) {
      cout << "** Can't do test 5 now because rectangle is gone; "
              "Use 2 to bring it back\n"
           << flush;
    } else {
      static bool mode5 = false;
      if (mode5) {
        mode5 = false;
        eek.Set(Am_LEFT, 5).Set(Am_TOP, 5);
      } else {
        mode5 = true;
        eek.Set(Am_LEFT, 10).Set(Am_TOP, 10);
      }
    }
  } else if (c == "6") {
    static bool mode6 = false;
    if (mode6) {
      mode6 = false;
      sw.Set(Am_TOP, 150);
    } else {
      mode6 = true;
      sw.Set(Am_TOP, 130);
    }
  } else if (c == "7") {
    static bool mode7 = false;
    if (mode7) {
      mode7 = false;
      sw.Set(Am_VISIBLE, true);
    } else {
      mode7 = true;
      sw.Set(Am_VISIBLE, false);
    }
  } else if (c == "8") {
    static bool mode8 = false;
    if (mode8) {
      mode8 = false;
      sw.Set(Am_WIDTH, 80);
    } else {
      mode8 = true;
      sw.Set(Am_WIDTH, 100);
    }
  } else if (c == "9") {
    static bool mode9 = false;
    if (mode9) {
      mode9 = false;
      window.Set(Am_WIDTH, 200);
    } else {
      mode9 = true;
      window.Set(Am_WIDTH, 250);
    }
  } else if (c == "a") {
    static bool modea = false;
    if (modea) {
      modea = false;
      r4.Set(Am_FILL_STYLE, Am_White);
    } else {
      modea = true;
      r4.Set(Am_FILL_STYLE, Am_Yellow);
    }
  } else if (c == "b") {
    static bool modeb = false;
    if (modeb) {
      modeb = false;
      second.Destroy();
    } else {
      modeb = true;
      second = window.Create("new window").Set(Am_LEFT, 375);
      int depth = second.Get_Object(PART1).Get(Am_OWNER_DEPTH);
      cout << "Depth of r1 = " << depth << " [-1]" << endl;
      Am_Screen.Add_Part(second);
    }
  } else if (c == "c") {
    static bool modec = false;
    if (modec) {
      modec = false;
      Am_Screen.Add_Part(window);
    } else {
      modec = true;
      window.Remove_From_Owner();
    }
  } else if (c == "d") {
    static bool moded = false;
    if (moded) {
      moded = false;
      third.Destroy();
    } else {
      moded = true;
      third = window.Copy().Set(Am_TOP, 455);
      Am_Screen.Add_Part(third);
    }
  } else if (c == "e") {
    static bool modee = false;
    if (modee) {
      modee = false;
      Am_To_Bottom(g1.Get_Object(OOK));
    } else {
      modee = true;
      Am_To_Top(g1.Get_Object(OOK));
    }
  } else if (c == "f") {
    static bool modef = false;
    if (modef) {
      modef = false;
      Am_To_Bottom(r1);
    } else {
      modef = true;
      Am_Move_Object(r1, r2, true);
    }
  } else if (c == "g") {
    static bool mode = false;
    mode = !mode;
    window.Set(Am_ICON_TITLE, mode ? "Hello World" : "Foo and Bar");
  } else if (c == "h") {
    static bool mode = false;
    mode = !mode;
    window.Set(Am_OMIT_TITLE_BAR, mode);
  } else if (c == "i") {
    static bool mode = false;
    mode = !mode;
    window.Set(Am_ICONIFIED, mode);
  } else if (c == "j") {
    static bool mode = false;
    window.Set(Am_FILL_STYLE, mode ? Am_Orange : Am_Blue);
    mode = !mode;
  } else if (c == "k") {
    static int mode = 0;
    switch (mode) {
    case 0:
      cout << "use min = false" << endl;
      window.Set(Am_MIN_WIDTH, 50);
      break;
    case 1:
      cout << "min width = 50" << endl;
      window.Set(Am_USE_MIN_WIDTH, true);
      break;
    case 2:
      cout << "min width = 70" << endl;
      window.Set(Am_MIN_WIDTH, 70);
      break;
    case 3:
      cout << "min width = false" << endl;
      window.Set(Am_USE_MIN_WIDTH, false);
      break;
    }
    mode = (mode + 1) % 4;
  } else if (c == "l") {
    static int mode = 0;
    switch (mode) {
    case 0:
      cout << "max width = false max height = 250" << endl;
      window.Set(Am_MAX_WIDTH, 200);
      window.Set(Am_MAX_HEIGHT, 250);
      window.Set(Am_USE_MAX_HEIGHT, true);
      break;
    case 1:
      cout << "max width = 200 max height = 250" << endl;
      window.Set(Am_USE_MAX_WIDTH, true);
      break;
    case 2:
      cout << "max width = 150 max height = false" << endl;
      window.Set(Am_MAX_WIDTH, 150);
      window.Set(Am_USE_MAX_HEIGHT, false);
      break;
    case 3:
      cout << "max width = false max height = false" << endl;
      window.Set(Am_USE_MAX_WIDTH, false);
      break;
    }
    mode = (mode + 1) % 4;
  } else if (c == "X") {
    int x1 = l1.Get(Am_X1);
    l1.Set(Am_X1, x1 + 5);
  } else if (c == "p") {
    int x = inter.Get(Am_FIRST_X);
    int y = inter.Get(Am_FIRST_Y);
    cout << "Checking point (" << x << "," << y << ")\n" << flush;
    Am_Object in_obj = Am_Point_In_Leaf(window, x, y, window);
    if (in_obj)
      cout << "   in object " << in_obj << endl << flush;
    else
      cout << " NOT in an object\n" << flush;
  } else if (c == "Y") {
    int x1 = l1.Get(Am_X1);
    int y1 = l1.Get(Am_Y1);
    l1.Set(Am_X1, x1 + 5);
    l1.Set(Am_Y1, y1 + 5);
  } else if (c == "M") {
    int left = l1.Get(Am_LEFT);
    // int top = l1.Get(Am_TOP);
    l1.Set(Am_LEFT, left + 5);
    // l1.Set(Am_TOP, top+5);
  } else if (c == "W") {
    int width = l1.Get(Am_WIDTH);
    //int height = l1.Get(Am_HEIGHT);
    l1.Set(Am_WIDTH, width + 5);
    //l1.Set(Am_HEIGHT, height+5);
  } else if (c == "R") {
    l1.Set(Am_X1, 70).Set(Am_Y1, 15).Set(Am_X2, 145).Set(Am_Y2, 145);
  } else if (c == "C") {
    cout << "** Adding object to a non-group obj. **THIS SHOULD CRASH**\n\n";
    Am_Object o2 = Am_Rectangle.Create();
    l1.Add_Part(o2);
  } else
    print_help();
}